

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O0

Abc_Obj_t * Lpk_Implement_rec(Lpk_Man_t *pMan,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,Lpk_Fun_t *pFun)

{
  uint uVar1;
  int iVar2;
  Lpk_Fun_t *pFun_00;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *Entry;
  int local_3c;
  int i;
  Abc_Obj_t *pRes;
  Abc_Obj_t *pFanin;
  Lpk_Fun_t *pFun_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Ntk_t *pNtk_local;
  Lpk_Man_t *pMan_local;
  
  local_3c = 0;
  while( true ) {
    if ((int)(*(uint *)&pFun->field_0x8 >> 7 & 0x1f) <= local_3c) {
      pAVar3 = Lpk_ImplementFun(pMan,pNtk,vLeaves,pFun);
      uVar1 = *(uint *)&pFun->field_0x8;
      Entry = Abc_ObjNot(pAVar3);
      Vec_PtrWriteEntry(vLeaves,uVar1 & 0x7f,Entry);
      Lpk_FunFree(pFun);
      return pAVar3;
    }
    pFun_00 = (Lpk_Fun_t *)Vec_PtrEntry(vLeaves,(int)pFun->pFanins[local_3c]);
    iVar2 = Abc_ObjIsComplement((Abc_Obj_t *)pFun_00);
    if (iVar2 == 0) {
      Lpk_Implement_rec(pMan,pNtk,vLeaves,pFun_00);
    }
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vLeaves,(int)pFun->pFanins[local_3c]);
    iVar2 = Abc_ObjIsComplement(pAVar3);
    if (iVar2 == 0) break;
    local_3c = local_3c + 1;
  }
  __assert_fail("Abc_ObjIsComplement(pFanin)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcDec.c"
                ,99,
                "Abc_Obj_t *Lpk_Implement_rec(Lpk_Man_t *, Abc_Ntk_t *, Vec_Ptr_t *, Lpk_Fun_t *)");
}

Assistant:

Abc_Obj_t * Lpk_Implement_rec( Lpk_Man_t * pMan, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, Lpk_Fun_t * pFun )
{
    Abc_Obj_t * pFanin, * pRes;
    int i;
    // prepare the leaves of the function
    for ( i = 0; i < (int)pFun->nVars; i++ )
    {
        pFanin = (Abc_Obj_t *)Vec_PtrEntry( vLeaves, pFun->pFanins[i] );
        if ( !Abc_ObjIsComplement(pFanin) )
            Lpk_Implement_rec( pMan, pNtk, vLeaves, (Lpk_Fun_t *)pFanin );
        pFanin = (Abc_Obj_t *)Vec_PtrEntry( vLeaves, pFun->pFanins[i] );
        assert( Abc_ObjIsComplement(pFanin) );
    }
    // construct the function
    pRes = Lpk_ImplementFun( pMan, pNtk, vLeaves, pFun );
    // replace the function
    Vec_PtrWriteEntry( vLeaves, pFun->Id, Abc_ObjNot(pRes) );
    Lpk_FunFree( pFun );
    return pRes;
}